

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_start(Context *ctx,char *profilestr)

{
  MOJOSHADER_shaderType MVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  MVar1 = ctx->shader_type;
  if (1 < MVar1 - MOJOSHADER_TYPE_PIXEL) {
    failf(ctx,"Shader type %u unsupported in this profile.");
    return;
  }
  if (ctx->mainfn != (char *)0x0) goto LAB_00112c53;
  if (MVar1 == MOJOSHADER_TYPE_PIXEL) {
    pcVar2 = (char *)(*ctx->malloc)(0xf,ctx->malloc_data);
    if (pcVar2 != (char *)0x0) {
      builtin_strncpy(pcVar2 + 7,"tShader",8);
      uVar3 = 0x746e656d67617246;
      goto LAB_00112c3a;
    }
LAB_00112c3f:
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    if (MVar1 != MOJOSHADER_TYPE_VERTEX) goto LAB_00112c53;
    pcVar2 = (char *)(*ctx->malloc)(0xd,ctx->malloc_data);
    if (pcVar2 == (char *)0x0) goto LAB_00112c3f;
    builtin_strncpy(pcVar2 + 5,"xShader",8);
    uVar3 = 0x6853786574726556;
LAB_00112c3a:
    *(undefined8 *)pcVar2 = uVar3;
  }
  ctx->mainfn = pcVar2;
LAB_00112c53:
  set_output(ctx,&ctx->mainline);
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_start(Context *ctx, const char *profilestr)
{
    if (!shader_is_vertex(ctx) && !shader_is_pixel(ctx))
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    if (!ctx->mainfn)
    {
        if (shader_is_vertex(ctx))
            ctx->mainfn = StrDup(ctx, "VertexShader");
        else if (shader_is_pixel(ctx))
            ctx->mainfn = StrDup(ctx, "FragmentShader");
    } // if

    set_output(ctx, &ctx->mainline);
    ctx->indent++;
}